

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unset_compression_request(fitsfile *fptr,int *status)

{
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  fptr->Fptr->request_compress_type = 0;
  fptr->Fptr->request_quantize_level = 0.0;
  fptr->Fptr->request_quantize_method = 0;
  fptr->Fptr->request_dither_seed = 0;
  fptr->Fptr->request_hcomp_scale = 0.0;
  fptr->Fptr->request_lossy_int_compress = 0;
  fptr->Fptr->request_huge_hdu = 0;
  for (ii = 0; ii < 6; ii = ii + 1) {
    fptr->Fptr->request_tilesize[ii] = 0;
  }
  return *status;
}

Assistant:

int fits_unset_compression_request(
      fitsfile *fptr,
      int *status) 
{
    int ii;

    (fptr->Fptr)->request_compress_type = 0;
    (fptr->Fptr)->request_quantize_level = 0;
    (fptr->Fptr)->request_quantize_method = 0;
    (fptr->Fptr)->request_dither_seed = 0; 
    (fptr->Fptr)->request_hcomp_scale = 0;
    (fptr->Fptr)->request_lossy_int_compress = 0;
    (fptr->Fptr)->request_huge_hdu = 0;

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        (fptr->Fptr)->request_tilesize[ii] = 0;
    }

    return(*status);
}